

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeString::toUTF8(UnicodeString *this,ByteSink *sink)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  UErrorCode UVar4;
  int iVar5;
  undefined4 extraout_var;
  char *dest;
  char16_t *pcVar6;
  uint srcLength;
  int32_t length8;
  UErrorCode errorCode;
  int32_t capacity;
  char stackBuffer [1024];
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (this->fUnion).fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  if (srcLength != 0) {
    capacity = 0x400;
    uVar3 = 0x400;
    if ((int)srcLength < 0x400) {
      uVar3 = srcLength;
    }
    iVar5 = (*sink->_vptr_ByteSink[3])
                      (sink,(ulong)uVar3,(ulong)(srcLength * 3),stackBuffer,0x400,&capacity);
    dest = (char *)CONCAT44(extraout_var,iVar5);
    pcVar6 = (char16_t *)0x0;
    length8 = 0;
    errorCode = U_ZERO_ERROR;
    uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar2 & 0x11) == 0) {
      if ((uVar2 & 2) == 0) {
        pcVar6 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar6 = (this->fUnion).fStackFields.fBuffer;
      }
    }
    u_strToUTF8WithSub_63(dest,capacity,&length8,pcVar6,srcLength,0xfffd,(int32_t *)0x0,&errorCode);
    UVar4 = errorCode;
    if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      dest = (char *)uprv_malloc_63((long)length8);
      if (dest == (char *)0x0) {
        return;
      }
      errorCode = U_ZERO_ERROR;
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar2 & 0x11) == 0) {
        if ((uVar2 & 2) == 0) {
          pcVar6 = (this->fUnion).fFields.fArray;
        }
        else {
          pcVar6 = (this->fUnion).fStackFields.fBuffer;
        }
      }
      else {
        pcVar6 = (char16_t *)0x0;
      }
      u_strToUTF8WithSub_63(dest,length8,&length8,pcVar6,srcLength,0xfffd,(int32_t *)0x0,&errorCode)
      ;
    }
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      (*sink->_vptr_ByteSink[2])(sink,dest,(ulong)(uint)length8);
      (*sink->_vptr_ByteSink[4])(sink);
    }
    if (UVar4 == U_BUFFER_OVERFLOW_ERROR) {
      uprv_free_63(dest);
    }
  }
  return;
}

Assistant:

void
UnicodeString::toUTF8(ByteSink &sink) const {
  int32_t length16 = length();
  if(length16 != 0) {
    char stackBuffer[1024];
    int32_t capacity = (int32_t)sizeof(stackBuffer);
    UBool utf8IsOwned = FALSE;
    char *utf8 = sink.GetAppendBuffer(length16 < capacity ? length16 : capacity,
                                      3*length16,
                                      stackBuffer, capacity,
                                      &capacity);
    int32_t length8 = 0;
    UErrorCode errorCode = U_ZERO_ERROR;
    u_strToUTF8WithSub(utf8, capacity, &length8,
                       getBuffer(), length16,
                       0xFFFD,  // Standard substitution character.
                       NULL,    // Don't care about number of substitutions.
                       &errorCode);
    if(errorCode == U_BUFFER_OVERFLOW_ERROR) {
      utf8 = (char *)uprv_malloc(length8);
      if(utf8 != NULL) {
        utf8IsOwned = TRUE;
        errorCode = U_ZERO_ERROR;
        u_strToUTF8WithSub(utf8, length8, &length8,
                           getBuffer(), length16,
                           0xFFFD,  // Standard substitution character.
                           NULL,    // Don't care about number of substitutions.
                           &errorCode);
      } else {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    if(U_SUCCESS(errorCode)) {
      sink.Append(utf8, length8);
      sink.Flush();
    }
    if(utf8IsOwned) {
      uprv_free(utf8);
    }
  }
}